

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O0

void __thiscall CLI::AutoTimer::AutoTimer(AutoTimer *this,string *title,time_print_t *time_print)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_60;
  string local_40;
  time_print_t *local_20;
  time_print_t *time_print_local;
  string *title_local;
  AutoTimer *this_local;
  
  local_20 = time_print;
  time_print_local = (time_print_t *)title;
  title_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_40,(string *)title);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_60,time_print);
  Timer::Timer(&this->super_Timer,&local_40,&local_60);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function(&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

AutoTimer(std::string title = "Timer", time_print_t time_print = Simple) : Timer(title, time_print) {}